

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompressorType::IfcCompressorType(IfcCompressorType *this)

{
  IfcCompressorType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1e0,"IfcCompressorType");
  Schema_2x3::IfcFlowMovingDeviceType::IfcFlowMovingDeviceType
            (&this->super_IfcFlowMovingDeviceType,&PTR_construction_vtable_24__00f931e0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompressorType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCompressorType,_1UL> *)
             &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0
             ,&PTR_construction_vtable_24__00f933c0);
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0xf93060;
  *(undefined8 *)&this->field_0x1e0 = 0xf931c8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0xf93088;
  (this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf930b0;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0xf930d8;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0xf93100;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0xf93128;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0xf93150;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0xf93178;
  *(undefined8 *)
   &(this->super_IfcFlowMovingDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0xf931a0;
  std::__cxx11::string::string((string *)&(this->super_IfcFlowMovingDeviceType).field_0x1c0);
  return;
}

Assistant:

IfcCompressorType() : Object("IfcCompressorType") {}